

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O2

int32_t __thiscall
icu_63::SimpleTimeZone::getOffset
          (SimpleTimeZone *this,uint8_t era,int32_t year,int32_t month,int32_t day,uint8_t dayOfWeek
          ,int32_t millis,int32_t param_7,UErrorCode *status)

{
  int8_t iVar1;
  int8_t iVar2;
  int iVar3;
  
  if ((uint)month < 0xc) {
    iVar1 = Grego::monthLength(year,month);
    iVar2 = Grego::previousMonthLength(year,month);
    iVar3 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0x15])
                      (this,(ulong)era,(ulong)(uint)year,(ulong)(uint)month,day,(ulong)dayOfWeek,
                       (ulong)(uint)millis,(ulong)(uint)(int)iVar1,(ulong)(uint)(int)iVar2,status);
  }
  else {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int32_t 
SimpleTimeZone::getOffset(uint8_t era, int32_t year, int32_t month, int32_t day,
                          uint8_t dayOfWeek, int32_t millis, 
                          int32_t /*monthLength*/, UErrorCode& status) const
{
    // Check the month before calling Grego::monthLength(). This
    // duplicates a test that occurs in the 9-argument getOffset(),
    // however, this is unavoidable. We don't mind because this method, in
    // fact, should not be called; internal code should always call the
    // 9-argument getOffset(), and outside code should use Calendar.get(int
    // field) with fields ZONE_OFFSET and DST_OFFSET. We can't get rid of
    // this method because it's public API. - liu 8/10/98
    if (month < UCAL_JANUARY
        || month > UCAL_DECEMBER) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return -1;
    }

    // We ignore monthLength because it can be derived from year and month.
    // This is so that February in leap years is calculated correctly.
    // We keep this argument in this function for backwards compatibility.
    return getOffset(era, year, month, day, dayOfWeek, millis,
                     Grego::monthLength(year, month),
                     Grego::previousMonthLength(year, month),
                     status);
}